

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestUpdateHandler.cxx
# Opt level: O0

int __thiscall cmCTestUpdateHandler::DetermineType(cmCTestUpdateHandler *this,char *cmd,char *type)

{
  cmCTest *pcVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  long lVar5;
  allocator local_589;
  string local_588;
  undefined1 local_568 [8];
  string stype_1;
  ostringstream local_528 [8];
  ostringstream cmCTestLog_msg_2;
  allocator local_3a9;
  string local_3a8;
  undefined1 local_388 [8];
  string stype;
  ostringstream local_348 [8];
  ostringstream cmCTestLog_msg_1;
  string local_1d0 [48];
  ostringstream local_1a0 [8];
  ostringstream cmCTestLog_msg;
  char *type_local;
  char *cmd_local;
  cmCTestUpdateHandler *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar3 = std::operator<<((ostream *)local_1a0,"Determine update type from command: ");
  poVar3 = std::operator<<(poVar3,cmd);
  poVar3 = std::operator<<(poVar3," and type: ");
  poVar3 = std::operator<<(poVar3,type);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,0,
               "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
               ,0x32,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  if ((type == (char *)0x0) || (*type == '\0')) {
    std::__cxx11::ostringstream::ostringstream(local_528);
    poVar3 = std::operator<<((ostream *)local_528,"Type not specified, check command: ");
    poVar3 = std::operator<<(poVar3,cmd);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,0,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                 ,0x4c,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string((string *)(stype_1.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream(local_528);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_588,cmd,&local_589);
    cmsys::SystemTools::LowerCase((string *)local_568,&local_588);
    std::__cxx11::string::~string((string *)&local_588);
    std::allocator<char>::~allocator((allocator<char> *)&local_589);
    lVar5 = std::__cxx11::string::find(local_568,0xb9fdbe);
    if (lVar5 == -1) {
      lVar5 = std::__cxx11::string::find(local_568,0xb9ff98);
      if (lVar5 == -1) {
        lVar5 = std::__cxx11::string::find(local_568,0xb9ffa3);
        if (lVar5 == -1) {
          lVar5 = std::__cxx11::string::find(local_568,0xb9ffa9);
          if (lVar5 == -1) {
            lVar5 = std::__cxx11::string::find(local_568,0xb9ffaf);
            if (lVar5 == -1) {
              lVar5 = std::__cxx11::string::find(local_568,0xb9ffb4);
              if (lVar5 == -1) {
                bVar2 = false;
              }
              else {
                this_local._4_4_ = 6;
                bVar2 = true;
              }
            }
            else {
              this_local._4_4_ = 5;
              bVar2 = true;
            }
          }
          else {
            this_local._4_4_ = 4;
            bVar2 = true;
          }
        }
        else {
          this_local._4_4_ = 3;
          bVar2 = true;
        }
      }
      else {
        this_local._4_4_ = 2;
        bVar2 = true;
      }
    }
    else {
      this_local._4_4_ = 1;
      bVar2 = true;
    }
    std::__cxx11::string::~string((string *)local_568);
    if (bVar2) {
      return this_local._4_4_;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_348);
    poVar3 = std::operator<<((ostream *)local_348,"Type specified: ");
    poVar3 = std::operator<<(poVar3,type);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,0,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmCTestUpdateHandler.cxx"
                 ,0x35,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string((string *)(stype.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream(local_348);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3a8,type,&local_3a9);
    cmsys::SystemTools::LowerCase((string *)local_388,&local_3a8);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
    lVar5 = std::__cxx11::string::find(local_388,0xb9fdbe);
    if (lVar5 == -1) {
      lVar5 = std::__cxx11::string::find(local_388,0xb9ff98);
      if (lVar5 == -1) {
        lVar5 = std::__cxx11::string::find(local_388,0xb9ffa3);
        if (lVar5 == -1) {
          lVar5 = std::__cxx11::string::find(local_388,0xb9ffa9);
          if (lVar5 == -1) {
            lVar5 = std::__cxx11::string::find(local_388,0xb9ffaf);
            if (lVar5 == -1) {
              lVar5 = std::__cxx11::string::find(local_388,0xb9ffb4);
              if (lVar5 == -1) {
                bVar2 = false;
              }
              else {
                this_local._4_4_ = 6;
                bVar2 = true;
              }
            }
            else {
              this_local._4_4_ = 5;
              bVar2 = true;
            }
          }
          else {
            this_local._4_4_ = 4;
            bVar2 = true;
          }
        }
        else {
          this_local._4_4_ = 3;
          bVar2 = true;
        }
      }
      else {
        this_local._4_4_ = 2;
        bVar2 = true;
      }
    }
    else {
      this_local._4_4_ = 1;
      bVar2 = true;
    }
    std::__cxx11::string::~string((string *)local_388);
    if (bVar2) {
      return this_local._4_4_;
    }
  }
  return 0;
}

Assistant:

int cmCTestUpdateHandler::DetermineType(const char* cmd, const char* type)
{
  cmCTestOptionalLog(this->CTest, DEBUG, "Determine update type from command: "
                       << cmd << " and type: " << type << std::endl,
                     this->Quiet);
  if (type && *type) {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Type specified: " << type << std::endl, this->Quiet);
    std::string stype = cmSystemTools::LowerCase(type);
    if (stype.find("cvs") != std::string::npos) {
      return cmCTestUpdateHandler::e_CVS;
    }
    if (stype.find("svn") != std::string::npos) {
      return cmCTestUpdateHandler::e_SVN;
    }
    if (stype.find("bzr") != std::string::npos) {
      return cmCTestUpdateHandler::e_BZR;
    }
    if (stype.find("git") != std::string::npos) {
      return cmCTestUpdateHandler::e_GIT;
    }
    if (stype.find("hg") != std::string::npos) {
      return cmCTestUpdateHandler::e_HG;
    }
    if (stype.find("p4") != std::string::npos) {
      return cmCTestUpdateHandler::e_P4;
    }
  } else {
    cmCTestOptionalLog(
      this->CTest, DEBUG,
      "Type not specified, check command: " << cmd << std::endl, this->Quiet);
    std::string stype = cmSystemTools::LowerCase(cmd);
    if (stype.find("cvs") != std::string::npos) {
      return cmCTestUpdateHandler::e_CVS;
    }
    if (stype.find("svn") != std::string::npos) {
      return cmCTestUpdateHandler::e_SVN;
    }
    if (stype.find("bzr") != std::string::npos) {
      return cmCTestUpdateHandler::e_BZR;
    }
    if (stype.find("git") != std::string::npos) {
      return cmCTestUpdateHandler::e_GIT;
    }
    if (stype.find("hg") != std::string::npos) {
      return cmCTestUpdateHandler::e_HG;
    }
    if (stype.find("p4") != std::string::npos) {
      return cmCTestUpdateHandler::e_P4;
    }
  }
  return cmCTestUpdateHandler::e_UNKNOWN;
}